

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osqp++.cc
# Opt level: O0

Status __thiscall
osqp::OsqpSolver::UpdatePolishRefineIter(OsqpSolver *this,int polish_refine_iter_new)

{
  bool bVar1;
  c_int cVar2;
  AlphaNum *in_RCX;
  int in_EDX;
  undefined4 in_register_00000034;
  unique_ptr<osqp::OSQPWorkspaceHelper,_osqp::OsqpSolver::OsqpDeleter> *this_00;
  string_view message;
  string_view message_00;
  string_view message_01;
  OSQPWorkspace *in_stack_fffffffffffffee8;
  basic_string_view<char,_std::char_traits<char>_> local_e0 [2];
  AlphaNum local_c0;
  AlphaNum local_90;
  string local_60;
  undefined1 local_40 [16];
  basic_string_view<char,_std::char_traits<char>_> local_30;
  int local_1c;
  unique_ptr<osqp::OSQPWorkspaceHelper,_osqp::OsqpSolver::OsqpDeleter> *puStack_18;
  int polish_refine_iter_new_local;
  OsqpSolver *this_local;
  
  this_00 = (unique_ptr<osqp::OSQPWorkspaceHelper,_osqp::OsqpSolver::OsqpDeleter> *)
            CONCAT44(in_register_00000034,polish_refine_iter_new);
  local_1c = in_EDX;
  puStack_18 = this_00;
  this_local = this;
  bVar1 = IsInitialized((OsqpSolver *)this_00);
  if (bVar1) {
    if (0.0 < (double)local_1c) {
      std::unique_ptr<osqp::OSQPWorkspaceHelper,_osqp::OsqpSolver::OsqpDeleter>::get(this_00);
      cVar2 = osqp_update_polish_refine_iter(in_stack_fffffffffffffee8,0x1bb28e);
      if (cVar2 == 0) {
        absl::OkStatus();
      }
      else {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (local_e0,"osqp_update_polish_refine_iter unexpectedly failed.");
        message_01._M_str = (char *)local_e0[0]._M_len;
        message_01._M_len = (size_t)this;
        absl::UnknownError(message_01);
      }
    }
    else {
      absl::AlphaNum::AlphaNum(&local_90,"Invalid polish_refine_iter value: ");
      absl::AlphaNum::AlphaNum(&local_c0,local_1c);
      absl::StrCat_abi_cxx11_(&local_60,(absl *)&local_90,&local_c0,in_RCX);
      local_40 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_60);
      message_00._M_str = local_40._0_8_;
      message_00._M_len = (size_t)this;
      absl::InvalidArgumentError(message_00);
      std::__cxx11::string::~string((string *)&local_60);
    }
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_30,"OsqpSolver is not initialized.");
    message._M_str = (char *)local_30._M_len;
    message._M_len = (size_t)this;
    absl::FailedPreconditionError(message);
  }
  return (Status)(uintptr_t)this;
}

Assistant:

absl::Status OsqpSolver::UpdatePolishRefineIter(
    const int polish_refine_iter_new) {
  if (!IsInitialized()) {
    return absl::FailedPreconditionError("OsqpSolver is not initialized.");
  }
  if (polish_refine_iter_new <= 0.0) {
    return absl::InvalidArgumentError(absl::StrCat(
        "Invalid polish_refine_iter value: ", polish_refine_iter_new));
  }
  if (osqp_update_polish_refine_iter(workspace_.get(),
                                     polish_refine_iter_new) != 0) {
    return absl::UnknownError(
        "osqp_update_polish_refine_iter unexpectedly failed.");
  }
  return absl::OkStatus();
}